

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::TSPI_PDU::TSPI_PDU(TSPI_PDU *this,KDataStream *stream)

{
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__TSPI_PDU_00221d30;
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_Loc);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_LinVel);
  DATA_TYPE::LE_EulerAngles::LE_EulerAngles(&this->m_Ori);
  DATA_TYPE::PositionError::PositionError(&this->m_PosErr);
  DATA_TYPE::OrientationError::OrientationError(&this->m_OriErr);
  DATA_TYPE::LE_DeadReckoningParameter::LE_DeadReckoningParameter(&this->m_DeadReckoningParameter);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&this->m_MeasureSpd);
  this->m_ui8SSDLen = '\0';
  (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*(this->super_LE_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

TSPI_PDU::TSPI_PDU(KDataStream &stream) noexcept(false) :
    m_ui8SSDLen( 0 )
{
    Decode( stream, false );
}